

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O1

void helper_v7m_vlldm_aarch64(CPUARMState_conflict *env,uint32_t fptr)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uintptr_t unaff_retaddr;
  
  uVar7 = (ulong)(env->v7m).secure;
  if (uVar7 == 0) {
    __assert_fail("env->v7m.secure",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                  ,0x407,"void helper_v7m_vlldm_aarch64(CPUARMState *, uint32_t)");
  }
  if (((env->v7m).control[1] & 8) == 0) {
    return;
  }
  if ((env->features & 0x200) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
LAB_0062907b:
        switch((env->v7m).cpacr[1] >> 0x14 & 3) {
        case 1:
switchD_0062906b_caseD_1:
          if (uVar3 != 0) goto switchD_0062906b_caseD_3;
          break;
        case 3:
switchD_0062906b_caseD_3:
          uVar3 = (env->v7m).fpccr[1];
          if ((uVar3 & 1) != 0) {
            (env->v7m).fpccr[1] = uVar3 & 0xfffffffe;
LAB_006291f6:
            puVar1 = (env->v7m).control + 1;
            *(byte *)puVar1 = (byte)*puVar1 | 4;
            return;
          }
          if ((fptr & 7) == 0) {
            uVar9 = 0;
            uVar8 = 0;
            uVar6 = fptr;
            do {
              uVar2 = uVar6;
              if (0xf < uVar8) {
                uVar2 = uVar6 + 8;
              }
              uVar4 = cpu_ldl_data_ra_aarch64(env,(ulong)uVar2,unaff_retaddr);
              uVar5 = cpu_ldl_data_ra_aarch64(env,(ulong)(uVar2 | 4),unaff_retaddr);
              (env->vfp).zregs[uVar8 >> 2].d[uVar9 & 1] = CONCAT44(uVar5,uVar4);
              uVar8 = uVar8 + 2;
              uVar9 = uVar9 + 1;
              uVar6 = uVar6 + 8;
            } while (uVar8 < (uVar3 >> 0x16 & 0x10) + 0x10);
            uVar6 = cpu_ldl_data_ra_aarch64(env,(ulong)(fptr + 0x40),unaff_retaddr);
            vfp_set_fpscr_aarch64(env,uVar6);
            goto LAB_006291f6;
          }
          uVar6 = 0x16;
          goto LAB_00629269;
        }
      }
      else if (uVar3 == 0x16) {
        uVar3 = 1;
        switch((env->v7m).cpacr[1] >> 0x14 & 3) {
        case 1:
          goto switchD_0062906b_caseD_1;
        case 3:
          goto switchD_0062906b_caseD_3;
        }
      }
      else {
        if (uVar3 != 0x1a) {
          uVar3 = 1;
          goto LAB_0062907b;
        }
        uVar3 = 1;
        switch((env->v7m).cpacr[1] >> 0x14 & 3) {
        case 1:
          goto switchD_0062906b_caseD_1;
        case 3:
          goto switchD_0062906b_caseD_3;
        }
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
      switch((env->v7m).cpacr[1] >> 0x14 & 3) {
      case 1:
        goto switchD_0062906b_caseD_1;
      case 3:
        goto switchD_0062906b_caseD_3;
      }
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception != 0) goto LAB_0062907b;
    uVar3 = ~(env->v7m).control[uVar7] & 1;
    switch((env->v7m).cpacr[1] >> 0x14 & 3) {
    case 1:
      goto switchD_0062906b_caseD_1;
    case 3:
      goto switchD_0062906b_caseD_3;
    }
  }
  uVar6 = 0x11;
LAB_00629269:
  raise_exception_ra_aarch64(env,uVar6,0,1,unaff_retaddr);
}

Assistant:

void HELPER(v7m_vlldm)(CPUARMState *env, uint32_t fptr)
{
    uintptr_t ra = GETPC();

    /* fptr is the value of Rn, the frame pointer we load the FP regs from */
    assert(env->v7m.secure);

    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)) {
        return;
    }

    /* Check access to the coprocessor is permitted */
    if (!v7m_cpacr_pass(env, true, arm_current_el(env) != 0)) {
        raise_exception_ra(env, EXCP_NOCP, 0, 1, GETPC());
    }

    if (env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_LSPACT_MASK) {
        /* State in FP is still valid */
        env->v7m.fpccr[M_REG_S] &= ~R_V7M_FPCCR_LSPACT_MASK;
    } else {
        bool ts = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK;
        int i;
        uint32_t fpscr;

        if (fptr & 7) {
            raise_exception_ra(env, EXCP_UNALIGNED, 0, 1, GETPC());
        }

        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint32_t slo, shi;
            uint64_t dn;
            uint32_t faddr = fptr + 4 * i;

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }

            slo = cpu_ldl_data_ra(env, faddr, ra);
            shi = cpu_ldl_data_ra(env, faddr + 4, ra);

            dn = (uint64_t) shi << 32 | slo;
            *aa32_vfp_dreg(env, i / 2) = dn;
        }
        fpscr = cpu_ldl_data_ra(env, fptr + 0x40, ra);
        vfp_set_fpscr(env, fpscr);
    }

    env->v7m.control[M_REG_S] |= R_V7M_CONTROL_FPCA_MASK;
}